

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_motion(_glist *x,t_floatarg xpos,t_floatarg ypos,t_floatarg fmod)

{
  _clock *p_Var1;
  _glist *p_Var2;
  int local_5c;
  int local_58;
  int guifsize;
  int fheight;
  int fwidth;
  t_object *ob;
  t_gobj *ptStack_40;
  int wantwidth;
  t_gobj *y1;
  int y12;
  int x12;
  int y11;
  int x11;
  _rtext *rt;
  int mod;
  t_floatarg fmod_local;
  t_floatarg ypos_local;
  t_floatarg xpos_local;
  _glist *x_local;
  
  rt._0_4_ = (int)fmod;
  rt._4_4_ = fmod;
  mod = (int)ypos;
  fmod_local = xpos;
  _ypos_local = x;
  if (x->gl_editor == (t_editor *)0x0) {
    bug("editor");
  }
  else {
    glist_setlastxy(x,(int)xpos,(int)ypos);
    if ((_ypos_local->gl_editor->field_0x88 & 7) == 1) {
      if (_ypos_local->gl_editor->e_clock == (_clock *)0x0) {
        p_Var1 = clock_new(_ypos_local,delay_move);
        _ypos_local->gl_editor->e_clock = p_Var1;
      }
      clock_unset(_ypos_local->gl_editor->e_clock);
      clock_delay(_ypos_local->gl_editor->e_clock,5.0);
      _ypos_local->gl_editor->e_xnew = (int)fmod_local;
      _ypos_local->gl_editor->e_ynew = (int)(float)mod;
    }
    else if ((_ypos_local->gl_editor->field_0x88 & 7) == 3) {
      canvas_doregion(_ypos_local,(int)fmod_local,(int)(float)mod,0);
    }
    else if ((_ypos_local->gl_editor->field_0x88 & 7) == 2) {
      canvas_doconnect(_ypos_local,(int)fmod_local,(int)(float)mod,(int)rt,0);
      _ypos_local->gl_editor->e_xnew = (int)fmod_local;
      _ypos_local->gl_editor->e_ynew = (int)(float)mod;
    }
    else if ((_ypos_local->gl_editor->field_0x88 & 7) == 4) {
      if (_ypos_local->gl_editor->e_motionfn == (t_glistmotionfn)0x0) {
        bug("e_motionfn");
      }
      (*_ypos_local->gl_editor->e_motionfn)
                (_ypos_local->gl_editor->e_grab,fmod_local - (float)_ypos_local->gl_editor->e_xwas,
                 (float)mod - (float)_ypos_local->gl_editor->e_ywas,0.0);
      _ypos_local->gl_editor->e_xwas = (int)fmod_local;
      _ypos_local->gl_editor->e_ywas = (int)(float)mod;
    }
    else if ((_ypos_local->gl_editor->field_0x88 & 7) == 5) {
      _y11 = _ypos_local->gl_editor->e_textedfor;
      if (_y11 != (_rtext *)0x0) {
        rtext_mouse(_y11,(int)(fmod_local - (float)_ypos_local->gl_editor->e_xwas),
                    (int)((float)mod - (float)_ypos_local->gl_editor->e_ywas),2);
      }
    }
    else if ((_ypos_local->gl_editor->field_0x88 & 7) == 6) {
      x12 = 0;
      y12 = 0;
      y1._4_4_ = 0;
      y1._0_4_ = 0;
      ptStack_40 = canvas_findhitbox(_ypos_local,_ypos_local->gl_editor->e_xwas,
                                     _ypos_local->gl_editor->e_ywas,&x12,&y12,(int *)((long)&y1 + 4)
                                     ,(int *)&y1);
      if (ptStack_40 != (t_gobj *)0x0) {
        ob._4_4_ = (int)(fmod_local - (float)x12);
        _fheight = pd_checkobject(&ptStack_40->g_pd);
        if ((_fheight == (t_object *)0x0) ||
           (((((_fheight->te_g).g_pd)->c_wb != &text_widgetbehavior &&
             ((_fheight->field_0x2e & 3) != 3)) &&
            ((p_Var2 = pd_checkglist((t_pd *)_fheight), p_Var2 == (_glist *)0x0 ||
             (((ushort)_fheight[4].te_xpix >> 8 & 1) != 0)))))) {
          if ((_fheight == (t_object *)0x0) || ((_fheight->te_g).g_pd != canvas_class)) {
            post("not resizable");
          }
          else {
            gobj_vis(ptStack_40,_ypos_local,0);
            *(int *)&_fheight[1].te_inlet =
                 (int)((float)*(int *)&_fheight[1].te_inlet +
                      (fmod_local - (float)_ypos_local->gl_editor->e_xnew));
            *(int *)((long)&_fheight[1].te_inlet + 4) =
                 (int)((float)*(int *)((long)&_fheight[1].te_inlet + 4) +
                      ((float)mod - (float)_ypos_local->gl_editor->e_ynew));
            _ypos_local->gl_editor->e_xnew = (int)fmod_local;
            _ypos_local->gl_editor->e_ynew = (int)(float)mod;
            canvas_fixlinesfor(_ypos_local,_fheight);
            gobj_vis(ptStack_40,_ypos_local,1);
          }
        }
        else {
          text_getfont(_fheight,_ypos_local,&guifsize,&local_58,&local_5c);
          ob._4_4_ = ob._4_4_ / guifsize;
          if (ob._4_4_ < 1) {
            ob._4_4_ = 1;
          }
          _fheight->te_width = (short)ob._4_4_;
          gobj_vis(ptStack_40,_ypos_local,0);
          canvas_fixlinesfor(_ypos_local,_fheight);
          gobj_vis(ptStack_40,_ypos_local,1);
        }
      }
    }
    else {
      canvas_doclick(_ypos_local,(int)fmod_local,(int)(float)mod,0,(int)rt,0);
    }
    _ypos_local->gl_editor->field_0x88 = _ypos_local->gl_editor->field_0x88 & 0xf7 | 8;
  }
  return;
}

Assistant:

void canvas_motion(t_canvas *x, t_floatarg xpos, t_floatarg ypos,
    t_floatarg fmod)
{
#if 0
    post("motion %g %g %g", xpos, ypos, fmod);
#endif
    int mod = fmod;
    if (!x->gl_editor)
    {
        bug("editor");
        return;
    }
    glist_setlastxy(x, xpos, ypos);
    if (x->gl_editor->e_onmotion == MA_MOVE)
    {
        if (!x->gl_editor->e_clock)
            x->gl_editor->e_clock = clock_new(x, (t_method)delay_move);
        clock_unset(x->gl_editor->e_clock);
        clock_delay(x->gl_editor->e_clock, 5);
        x->gl_editor->e_xnew = xpos;
        x->gl_editor->e_ynew = ypos;
    }
    else if (x->gl_editor->e_onmotion == MA_REGION)
        canvas_doregion(x, xpos, ypos, 0);
    else if (x->gl_editor->e_onmotion == MA_CONNECT)
    {
        canvas_doconnect(x, xpos, ypos, mod, 0);
        x->gl_editor->e_xnew = xpos;
        x->gl_editor->e_ynew = ypos;
    }
    else if (x->gl_editor->e_onmotion == MA_PASSOUT)
    {
        if (!x->gl_editor->e_motionfn)
            bug("e_motionfn");
        (*x->gl_editor->e_motionfn)(&x->gl_editor->e_grab->g_pd,
            xpos - x->gl_editor->e_xwas, ypos - x->gl_editor->e_ywas, 0);
        x->gl_editor->e_xwas = xpos;
        x->gl_editor->e_ywas = ypos;
    }
    else if (x->gl_editor->e_onmotion == MA_DRAGTEXT)
    {
        t_rtext *rt = x->gl_editor->e_textedfor;
        if (rt)
            rtext_mouse(rt, xpos - x->gl_editor->e_xwas,
                ypos - x->gl_editor->e_ywas, RTEXT_DRAG);
    }
    else if (x->gl_editor->e_onmotion == MA_RESIZE)
    {
        int x11=0, y11=0, x12=0, y12=0;
        t_gobj *y1;
        if ((y1 = canvas_findhitbox(x,
            x->gl_editor->e_xwas, x->gl_editor->e_ywas,
                &x11, &y11, &x12, &y12)))
        {
            int wantwidth = xpos - x11;
            t_object *ob = pd_checkobject(&y1->g_pd);
            if (ob && ((ob->te_pd->c_wb == &text_widgetbehavior) ||
                ob->te_type == T_ATOM ||
                    (pd_checkglist(&ob->te_pd) &&
                     !((t_canvas *)ob)->gl_isgraph)))
            {
                int fwidth, fheight, guifsize;
                text_getfont(ob, x, &fwidth, &fheight, &guifsize);
                wantwidth = wantwidth / fwidth;
                if (wantwidth < 1)
                    wantwidth = 1;
                ob->te_width = wantwidth;
                gobj_vis(y1, x, 0);
                canvas_fixlinesfor(x, ob);
                gobj_vis(y1, x, 1);
            }
            else if (ob && ob->ob_pd == canvas_class)
            {
                gobj_vis(y1, x, 0);
                ((t_canvas *)ob)->gl_pixwidth += xpos - x->gl_editor->e_xnew;
                ((t_canvas *)ob)->gl_pixheight += ypos - x->gl_editor->e_ynew;
                x->gl_editor->e_xnew = xpos;
                x->gl_editor->e_ynew = ypos;
                canvas_fixlinesfor(x, ob);
                gobj_vis(y1, x, 1);
            }
            else post("not resizable");
        }
    }
    else canvas_doclick(x, xpos, ypos, 0, mod, 0);

    x->gl_editor->e_lastmoved = 1;
}